

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetMessage
          (ExtensionSet *this,int number,Descriptor *message_type,MessageFactory *factory)

{
  int iVar1;
  Extension *pEVar2;
  Nonnull<const_char_*> failure_msg;
  undefined4 extraout_var;
  MessageLite *pMVar3;
  undefined4 extraout_var_01;
  Label local_34;
  LogMessageFatal local_30;
  undefined4 extraout_var_00;
  
  pEVar2 = FindOrNull(this,number);
  if ((pEVar2 != (Extension *)0x0) && ((pEVar2->field_0xa & 2) == 0)) {
    local_30.super_LogMessage.errno_saver_.saved_errno_ = (uint)pEVar2->is_repeated * 2 + 1;
    local_34 = LABEL_OPTIONAL;
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::Label,google::protobuf::internal::FieldDescriptorLite::Label>
                            ((Label *)&local_30,&local_34,
                             "(*extension).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL == FieldDescriptor::LABEL_OPTIONAL"
                            );
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      local_30.super_LogMessage.errno_saver_.saved_errno_ =
           *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pEVar2->type * 4);
      local_34 = 10;
      failure_msg = absl::lts_20250127::log_internal::
                    Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::CppType,google::protobuf::internal::FieldDescriptorLite::CppType>
                              ((CppType *)&local_30,&local_34,
                               "cpp_type((*extension).type) == FieldDescriptor::CPPTYPE_MESSAGE");
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        pMVar3 = (MessageLite *)(pEVar2->field_0).int64_t_value;
        if ((pEVar2->field_0xa & 4) != 0) {
          iVar1 = (*factory->_vptr_MessageFactory[2])(factory,message_type);
          iVar1 = (*pMVar3->_vptr_MessageLite[3])(pMVar3,CONCAT44(extraout_var,iVar1),this->arena_);
          pMVar3 = (MessageLite *)CONCAT44(extraout_var_00,iVar1);
        }
        return pMVar3;
      }
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_heavy.cc"
               ,0x7b,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
  }
  iVar1 = (*factory->_vptr_MessageFactory[2])(factory,message_type);
  return (MessageLite *)CONCAT44(extraout_var_01,iVar1);
}

Assistant:

const MessageLite& ExtensionSet::GetMessage(int number,
                                            const Descriptor* message_type,
                                            MessageFactory* factory) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr || extension->is_cleared) {
    // Not present.  Return the default value.
    return *factory->GetPrototype(message_type);
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    if (extension->is_lazy) {
      return extension->ptr.lazymessage_value->GetMessage(
          *factory->GetPrototype(message_type), arena_);
    } else {
      return *extension->ptr.message_value;
    }
  }
}